

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisnsf.cpp
# Opt level: O2

void usage(char *progname)

{
  printf("%s %s\n","minisnsf","[2015-04-12]");
  printf("<%s>\n","http://github.com/loveemu/minisnsf");
  putchar(10);
  puts("Usage");
  puts("-----");
  putchar(10);
  printf("Syntax: `%s (options) [Base name] [Offset] [Size] [Count]`\n",progname);
  putchar(10);
  puts("or");
  putchar(10);
  printf("Syntax: `%s (options) [Base name] [Offset] =[Hex pattern] [Count]`\n",progname);
  putchar(10);
  puts("### Options");
  putchar(10);
  puts("`--help`");
  puts("  : Show help");
  putchar(10);
  puts("`--psfby`, `--snsfby` [name]");
  puts("  : Set creator name of SNSF");
  putchar(10);
  return;
}

Assistant:

static void usage(const char * progname)
{
	printf("%s %s\n", APP_NAME, APP_VER);
	printf("<%s>\n", APP_URL);
	printf("\n");
	printf("Usage\n");
	printf("-----\n");
	printf("\n");
	printf("Syntax: `%s (options) [Base name] [Offset] [Size] [Count]`\n", progname);
	printf("\n");
	printf("or\n");
	printf("\n");
	printf("Syntax: `%s (options) [Base name] [Offset] =[Hex pattern] [Count]`\n", progname);
	printf("\n");

	printf("### Options\n");
	printf("\n");
	printf("`--help`\n");
	printf("  : Show help\n");
	printf("\n");
	printf("`--psfby`, `--snsfby` [name]\n");
	printf("  : Set creator name of SNSF\n");
	printf("\n");
}